

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_segment.cpp
# Opt level: O3

void duckdb::SwapTupleDataSegment(TupleDataSegment *a,TupleDataSegment *b)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  TupleDataLayout *pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  idx_t iVar5;
  pointer pBVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  pointer pTVar13;
  pointer pTVar14;
  pointer pTVar15;
  pointer pTVar16;
  pointer pTVar17;
  pointer pTVar18;
  pointer pBVar19;
  pointer pBVar20;
  pointer pBVar21;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_68;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_48;
  
  uVar7 = *(undefined4 *)
           &(a->allocator).internal.
            super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar8 = *(undefined4 *)
           ((long)&(a->allocator).internal.
                   super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           + 4);
  uVar9 = *(undefined4 *)
           &(a->allocator).internal.
            super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  uVar10 = *(undefined4 *)
            ((long)&(a->allocator).internal.
                    super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (a->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (a->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar11 = (b->allocator).internal.
            super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var12 = (b->allocator).internal.
            super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (b->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (b->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (a->allocator).internal.
           super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (a->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar11;
  (a->allocator).internal.super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var12;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (b->allocator).internal.
           super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  *(undefined4 *)
   &(b->allocator).internal.
    super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar7;
  *(undefined4 *)
   ((long)&(b->allocator).internal.
           super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       uVar8;
  *(undefined4 *)
   &(b->allocator).internal.
    super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       uVar9;
  *(undefined4 *)
   ((long)&(b->allocator).internal.
           super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 4) = uVar10;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pTVar2 = (a->layout)._M_data;
  (a->layout)._M_data = (b->layout)._M_data;
  (b->layout)._M_data = pTVar2;
  pTVar3 = (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>
           .super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar13 = (a->chunks).
            super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
            super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pTVar14 = (a->chunks).
            super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
            super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar15 = (b->chunks).
            super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
            super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
       super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
       super__Vector_impl_data._M_start;
  (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar15;
  (a->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
       super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>::~vector
            ((vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_> *)&local_68);
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(b->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pTVar3;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(b->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(b->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar13;
  (b->chunks).super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar14;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>::~vector
            ((vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_> *)&local_68);
  ::std::vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>::~vector
            ((vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_> *)&local_48);
  pTVar4 = (a->chunk_parts).
           super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
           super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar16 = (a->chunk_parts).
            super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
            super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar17 = (a->chunk_parts).
            super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
            super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (a->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar18 = (b->chunk_parts).
            super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
            super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (a->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (b->chunk_parts).
       super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
       super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (a->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_finish = pTVar18;
  (a->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->chunk_parts).
       super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
       super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_start = pTVar16;
  (b->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_finish = pTVar17;
  (b->chunk_parts).
  super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar4;
  iVar5 = a->count;
  a->count = b->count;
  b->count = iVar5;
  iVar5 = a->data_size;
  a->data_size = b->data_size;
  b->data_size = iVar5;
  pBVar6 = (a->pinned_row_handles).
           super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
           super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pBVar19 = (a->pinned_row_handles).
            super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
            super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar20 = (a->pinned_row_handles).
            super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
            super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (a->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar21 = (b->pinned_row_handles).
            super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
            super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (a->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_start;
  (a->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar21;
  (a->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (b->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (b->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_68);
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (b->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pBVar6;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (b->pinned_row_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (b->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = pBVar19;
  (b->pinned_row_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar20;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_68);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_48);
  pBVar6 = (a->pinned_heap_handles).
           super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
           super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pBVar19 = (a->pinned_heap_handles).
            super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
            super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar20 = (a->pinned_heap_handles).
            super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
            super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (a->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (a->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar21 = (b->pinned_heap_handles).
            super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
            super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (a->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_start;
  (a->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar21;
  (a->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (b->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (b->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_68);
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (b->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pBVar6;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (b->pinned_heap_handles).
       super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
       super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (b->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = pBVar19;
  (b->pinned_heap_handles).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
  .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar20;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_68);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_48);
  return;
}

Assistant:

void SwapTupleDataSegment(TupleDataSegment &a, TupleDataSegment &b) {
	std::swap(a.allocator, b.allocator);
	std::swap(a.layout, b.layout);
	std::swap(a.chunks, b.chunks);
	std::swap(a.chunk_parts, b.chunk_parts);
	std::swap(a.count, b.count);
	std::swap(a.data_size, b.data_size);
	std::swap(a.pinned_row_handles, b.pinned_row_handles);
	std::swap(a.pinned_heap_handles, b.pinned_heap_handles);
}